

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O2

vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> * __thiscall
Blob_Detection::BlobDetection::find
          (BlobDetection *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
          BlobParameters parameter,uint8_t threshold)

{
  _List_node_base **this_00;
  int iVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  BlobDetection *pBVar5;
  uint uVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  uchar *puVar9;
  pointer puVar10;
  undefined4 in_register_00000014;
  long lVar11;
  uchar *puVar12;
  ulong uVar13;
  ulong uVar14;
  __off64_t *__offout;
  uint32_t uVar15;
  undefined4 in_register_0000008c;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  char cVar20;
  uint uVar21;
  uint32_t xMap;
  uint in_stack_fffffffffffffe18;
  uint local_1e0;
  value_type_conflict4 local_1dc;
  _List_node_base **local_1d8;
  _List_node_base *local_1d0;
  _List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> local_1c8;
  ulong local_1b0;
  pointer local_1a8;
  ulong local_1a0;
  ulong local_198;
  long local_190;
  int local_188;
  int iStack_184;
  int local_180;
  int iStack_17c;
  _List_node_base *local_178;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  BlobDetection *local_158;
  pointer local_150;
  _List_node_base **local_148;
  _List_node_base *local_140;
  BlobInfo local_138;
  
  local_1a0 = CONCAT44(in_register_00000014,x);
  __offout = (__off64_t *)(ulong)height;
  uVar15 = height;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  BlobParameters::_verify(&parameter);
  local_158 = this;
  std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::clear
            (&this->_blob);
  uVar16 = (ulong)(width + 2);
  local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_138._pointX.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_170,
             (ulong)((height + 2) * (width + 2)),(value_type_conflict1 *)&local_138,
             (allocator_type *)&local_1c8);
  uVar6 = image->_rowSize;
  local_198 = (ulong)y;
  local_1b0 = uVar16;
  uVar13 = (ulong)width;
  puVar9 = image->_data + (local_1a0 & 0xffffffff) + (ulong)(uVar6 * y);
  puVar12 = puVar9 + height * uVar6;
  lVar11 = CONCAT44(local_170._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (int)local_170._M_impl.super__Vector_impl_data._M_start) + 1;
  for (; lVar11 = lVar11 + uVar16, puVar9 != puVar12; puVar9 = puVar9 + uVar6) {
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      if (threshold <= puVar9[uVar14]) {
        *(undefined1 *)(lVar11 + uVar14) = 1;
      }
    }
  }
  local_1c8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_1c8;
  local_1c8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1c8;
  local_1c8._M_impl._M_node._M_size = 0;
  puVar10 = (pointer)(CONCAT44(local_170._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (int)local_170._M_impl.super__Vector_impl_data._M_start) + uVar16);
  local_190 = -uVar16;
  local_150 = local_170._M_impl.super__Vector_impl_data._M_finish + -uVar16;
  iStack_184 = (int)local_1a0 + -1;
  local_188 = y - 1;
  do {
    if (puVar10 == local_150) {
      if ((parameter.circularity.checkMaximum != false) ||
         (parameter.circularity.checkMinimum == true)) {
        p_Var7 = (_List_node_base *)&local_1c8;
        while (p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next,
              p_Var7 != (_List_node_base *)&local_1c8) {
          BlobInfo::_getCircularity((BlobInfo *)(p_Var7 + 1));
        }
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var7 = local_1c8._M_impl._M_node.super__List_node_base._M_next;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_138;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_138;
        while (p_Var8 = p_Var7, p_Var8 != (_List_node_base *)&local_1c8) {
          p_Var7 = p_Var8->_M_next;
          if (((parameter.circularity.checkMaximum == true) &&
              (parameter.circularity.maximum < (double)p_Var8[0xd]._M_next)) ||
             ((parameter.circularity.checkMinimum == true &&
              ((double)p_Var8[0xd]._M_next < parameter.circularity.minimum)))) {
            std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
            ::splice((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                     &local_138,
                     (int)local_138._pointX.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,(__off64_t *)&local_1c8,(int)p_Var8,
                     __offout,CONCAT44(in_register_0000008c,uVar15),in_stack_fffffffffffffe18);
          }
        }
        std::__cxx11::
        _List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::_M_clear
                  ((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                    *)&local_138);
      }
      if ((parameter.elongation.checkMaximum != false) ||
         (parameter.elongation.checkMinimum == true)) {
        p_Var7 = (_List_node_base *)&local_1c8;
        while (p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next,
              p_Var7 != (_List_node_base *)&local_1c8) {
          BlobInfo::_getElongation((BlobInfo *)(p_Var7 + 1));
        }
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var7 = local_1c8._M_impl._M_node.super__List_node_base._M_next;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_138;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_138;
        while (p_Var8 = p_Var7, p_Var8 != (_List_node_base *)&local_1c8) {
          p_Var7 = p_Var8->_M_next;
          if (((parameter.elongation.checkMaximum == true) &&
              (parameter.elongation.maximum < (double)p_Var8[0xe]._M_next)) ||
             ((parameter.elongation.checkMinimum == true &&
              ((double)p_Var8[0xe]._M_next < parameter.elongation.minimum)))) {
            std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
            ::splice((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                     &local_138,
                     (int)local_138._pointX.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,(__off64_t *)&local_1c8,(int)p_Var8,
                     __offout,CONCAT44(in_register_0000008c,uVar15),in_stack_fffffffffffffe18);
          }
        }
        std::__cxx11::
        _List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::_M_clear
                  ((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                    *)&local_138);
      }
      if ((parameter.height.checkMaximum != false) || (parameter.height.checkMinimum == true)) {
        p_Var7 = (_List_node_base *)&local_1c8;
        while (p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next,
              p_Var7 != (_List_node_base *)&local_1c8) {
          BlobInfo::_getHeight((BlobInfo *)(p_Var7 + 1));
        }
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var7 = local_1c8._M_impl._M_node.super__List_node_base._M_next;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_138;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_138;
        while (p_Var8 = p_Var7, p_Var8 != (_List_node_base *)&local_1c8) {
          p_Var7 = p_Var8->_M_next;
          if (((parameter.height.checkMaximum == true) &&
              (parameter.height.maximum < *(uint *)&p_Var8[0xf]._M_next)) ||
             ((parameter.height.checkMinimum == true &&
              (*(uint *)&p_Var8[0xf]._M_next < parameter.height.minimum)))) {
            std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
            ::splice((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                     &local_138,
                     (int)local_138._pointX.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,(__off64_t *)&local_1c8,(int)p_Var8,
                     __offout,CONCAT44(in_register_0000008c,uVar15),in_stack_fffffffffffffe18);
          }
        }
        std::__cxx11::
        _List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::_M_clear
                  ((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                    *)&local_138);
      }
      if ((parameter.length.checkMaximum != false) || (parameter.length.checkMinimum == true)) {
        p_Var7 = (_List_node_base *)&local_1c8;
        while (p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next,
              p_Var7 != (_List_node_base *)&local_1c8) {
          BlobInfo::_getLength((BlobInfo *)(p_Var7 + 1));
        }
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var7 = local_1c8._M_impl._M_node.super__List_node_base._M_next;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_138;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_138;
        while (p_Var8 = p_Var7, p_Var8 != (_List_node_base *)&local_1c8) {
          p_Var7 = p_Var8->_M_next;
          if (((parameter.length.checkMaximum == true) &&
              (parameter.length.maximum < (double)p_Var8[0xf]._M_prev)) ||
             ((parameter.length.checkMinimum == true &&
              ((double)p_Var8[0xf]._M_prev < parameter.length.minimum)))) {
            std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
            ::splice((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                     &local_138,
                     (int)local_138._pointX.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,(__off64_t *)&local_1c8,(int)p_Var8,
                     __offout,CONCAT44(in_register_0000008c,uVar15),in_stack_fffffffffffffe18);
          }
        }
        std::__cxx11::
        _List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::_M_clear
                  ((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                    *)&local_138);
      }
      if ((parameter.size.checkMaximum != false) || (parameter.size.checkMinimum == true)) {
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var7 = local_1c8._M_impl._M_node.super__List_node_base._M_next;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_138;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_138;
        while (p_Var8 = p_Var7, p_Var8 != (_List_node_base *)&local_1c8) {
          p_Var7 = p_Var8->_M_next;
          if (((parameter.size.checkMaximum == true) &&
              ((ulong)parameter.size.maximum <
               (ulong)((long)p_Var8[1]._M_prev - (long)p_Var8[1]._M_next >> 2))) ||
             ((parameter.size.checkMinimum == true &&
              ((ulong)((long)p_Var8[1]._M_prev - (long)p_Var8[1]._M_next >> 2) <
               (ulong)parameter.size.minimum)))) {
            std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
            ::splice((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                     &local_138,
                     (int)local_138._pointX.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,(__off64_t *)&local_1c8,(int)p_Var8,
                     __offout,CONCAT44(in_register_0000008c,uVar15),in_stack_fffffffffffffe18);
          }
        }
        std::__cxx11::
        _List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::_M_clear
                  ((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                    *)&local_138);
      }
      p_Var7 = (_List_node_base *)&local_1c8;
      if ((parameter.width.checkMaximum != false) || (parameter.width.checkMinimum == true)) {
        while (p_Var7 = (((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                           *)p_Var7)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var7 != (_List_node_base *)&local_1c8) {
          BlobInfo::_getWidth((BlobInfo *)(p_Var7 + 1));
        }
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        p_Var7 = local_1c8._M_impl._M_node.super__List_node_base._M_next;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_138;
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_138;
        while (p_Var8 = p_Var7, p_Var8 != (_List_node_base *)&local_1c8) {
          p_Var7 = (((_List_impl *)&p_Var8->_M_next)->_M_node).super__List_node_base._M_next;
          if (((parameter.width.checkMaximum == true) &&
              (parameter.width.maximum < *(uint *)&p_Var8[0x10]._M_prev)) ||
             ((parameter.width.checkMinimum == true &&
              (*(uint *)&p_Var8[0x10]._M_prev < parameter.width.minimum)))) {
            std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
            ::splice((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                     &local_138,
                     (int)local_138._pointX.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,(__off64_t *)&local_1c8,(int)p_Var8,
                     __offout,CONCAT44(in_register_0000008c,uVar15),in_stack_fffffffffffffe18);
          }
        }
        std::__cxx11::
        _List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::_M_clear
                  ((_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                    *)&local_138);
      }
      std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
      vector<std::_List_iterator<Blob_Detection::BlobInfo>,void>
                ((vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>> *)
                 &local_138,
                 (_List_iterator<Blob_Detection::BlobInfo>)
                 local_1c8._M_impl._M_node.super__List_node_base._M_next,
                 (_List_node_base *)&local_1c8,(allocator_type *)&local_1dc);
      pBVar5 = local_158;
      pBVar2 = (local_158->_blob).
               super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (local_158->_blob).
      super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_138._pointX.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      pBVar3 = (local_158->_blob).
               super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pBVar4 = (local_158->_blob).
               super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (local_158->_blob).
      super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)local_138._pointX.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (local_158->_blob).
      super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_138._pointX.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pBVar3;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pBVar4;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pBVar2;
      std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
                ((vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                 &local_138);
      std::__cxx11::_List_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
      ::_M_clear(&local_1c8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_170);
      return &pBVar5->_blob;
    }
    local_1a8 = puVar10;
    if (*puVar10 == '\x01') {
      local_138._circularity.value = 0.0;
      local_138._circularity.found = false;
      local_138._circularity._9_7_ = 0;
      local_138._elongation.value = 0.0;
      local_138._elongation.found = false;
      local_138._elongation._9_7_ = 0;
      local_138._height.value = 0;
      local_138._height.found = false;
      local_138._height._5_3_ = 0;
      local_138._length.value = 0.0;
      local_138._length.found = false;
      local_138._length._9_7_ = 0;
      local_138._width.value = 0;
      local_138._width.found = false;
      local_138._width._5_3_ = 0;
      local_138._edgeY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138._edgeY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138._area.value.left = 0;
      local_138._area.value.right = 0;
      local_138._area.value.top = 0;
      local_138._area.value.bottom = 0;
      local_138._area.found = false;
      local_138._area._17_3_ = 0;
      local_138._164_4_ = 0;
      local_138._center.value.x = 0.0;
      local_138._center.value.y = 0.0;
      local_138._center.found = false;
      local_138._center._17_7_ = 0;
      local_138._contourX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138._contourY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138._contourY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138._contourY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138._edgeX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138._edgeX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138._edgeX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138._edgeY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138._pointY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138._pointY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138._pointY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138._contourX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138._contourX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
      push_back((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                &local_1c8,&local_138);
      BlobInfo::~BlobInfo(&local_138);
      p_Var8 = local_1c8._M_impl._M_node.super__List_node_base._M_prev;
      uVar6 = (int)local_1a8 - (int)local_170._M_impl.super__Vector_impl_data._M_start;
      local_1d0 = local_1c8._M_impl._M_node.super__List_node_base._M_prev + 1;
      uVar21 = uVar6 / (uint)local_1b0;
      iStack_17c = uVar6 % (uint)local_1b0 + iStack_184;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = iStack_17c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,(uint *)&local_138
                );
      local_180 = uVar21 + local_188;
      local_1d8 = &p_Var8[2]._M_prev;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_138._pointX.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,local_180);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,(uint *)&local_138
                );
      local_140 = p_Var8 + 7;
      local_148 = &p_Var8[8]._M_prev;
      lVar11 = 0;
      local_178 = p_Var8;
      *local_1a8 = '\x02';
      p_Var7 = p_Var8[1]._M_next;
      do {
        iVar1 = *(int *)((long)&p_Var7->_M_next + lVar11 * 4);
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_138._pointX.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,iVar1);
        local_1dc = *(value_type_conflict4 *)((long)&(*local_1d8)->_M_next + lVar11 * 4);
        lVar17 = (ulong)((iVar1 - (int)local_1a0) + 1) +
                 (ulong)(((local_1dc - (int)local_198) + 1) * (uint)local_1b0) +
                 CONCAT44(local_170._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)local_170._M_impl.super__Vector_impl_data._M_start);
        cVar20 = *(char *)(local_190 + -1 + lVar17);
        pcVar18 = (char *)(lVar17 + local_190);
        if (cVar20 != '\0') {
          if (cVar20 == '\x01') {
            local_1e0 = iVar1 - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,&local_1e0);
            local_1e0 = local_1dc - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_1e0);
            pcVar18[-1] = '\x02';
          }
          cVar20 = '\x01';
        }
        if (*pcVar18 != '\0') {
          if (*pcVar18 == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,
                       (value_type_conflict4 *)&local_138);
            local_1e0 = local_1dc - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_1e0);
            *pcVar18 = '\x02';
          }
          cVar20 = cVar20 + '\x01';
        }
        pcVar19 = pcVar18 + 1;
        if (pcVar18[1] != '\0') {
          if (pcVar18[1] == '\x01') {
            local_1e0 = (int)local_138._pointX.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,&local_1e0);
            local_1e0 = local_1dc - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_1e0);
            *pcVar19 = '\x02';
          }
          cVar20 = cVar20 + '\x01';
        }
        pcVar18 = pcVar19 + uVar13;
        if (pcVar19[uVar13] != '\0') {
          if (pcVar19[uVar13] == '\x01') {
            local_1e0 = (int)local_138._pointX.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,&local_1e0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_1dc);
            *pcVar18 = '\x02';
          }
          cVar20 = cVar20 + '\x01';
        }
        pcVar19 = pcVar18 + 2;
        if (pcVar18[2] != '\0') {
          if (pcVar18[2] == '\x01') {
            local_1e0 = (int)local_138._pointX.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,&local_1e0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_1dc);
            *pcVar19 = '\x02';
          }
          cVar20 = cVar20 + '\x01';
        }
        pcVar18 = pcVar19 + uVar13;
        if (pcVar19[uVar13] != '\0') {
          if (pcVar19[uVar13] == '\x01') {
            local_1e0 = (int)local_138._pointX.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,&local_1e0);
            local_1e0 = local_1dc + 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_1e0);
            *pcVar18 = '\x02';
          }
          cVar20 = cVar20 + '\x01';
        }
        if (pcVar18[1] != '\0') {
          if (pcVar18[1] == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,
                       (value_type_conflict4 *)&local_138);
            local_1e0 = local_1dc + 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_1e0);
            pcVar18[1] = '\x02';
          }
          cVar20 = cVar20 + '\x01';
        }
        if (pcVar18[2] == '\0') {
LAB_001103cd:
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_140,
                     (value_type_conflict4 *)&local_138);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148,&local_1dc);
          (pcVar18 + 1)[local_190] = '\x03';
        }
        else {
          if (pcVar18[2] == '\x01') {
            local_1e0 = (int)local_138._pointX.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d0,&local_1e0);
            local_1e0 = local_1dc + 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,&local_1e0);
            pcVar18[2] = '\x02';
            p_Var8 = local_178;
          }
          if (cVar20 != '\a') goto LAB_001103cd;
        }
        p_Var7 = p_Var8[1]._M_next;
        lVar11 = lVar11 + 1;
      } while (lVar11 != (long)p_Var8[1]._M_prev - (long)p_Var7 >> 2);
      p_Var7 = p_Var8 + 4;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = iStack_17c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var7,(uint *)&local_138);
      this_00 = &p_Var8[5]._M_prev;
      local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_138._pointX.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,local_180);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(uint *)&local_138);
      *local_1a8 = '\x04';
      p_Var8 = p_Var8[4]._M_next;
      lVar11 = 0;
      do {
        iVar1 = *(int *)((long)&p_Var8->_M_next + lVar11 * 4);
        local_138._pointX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_138._pointX.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,iVar1);
        local_1dc = *(value_type_conflict4 *)((long)&(*this_00)->_M_next + lVar11 * 4);
        lVar17 = (ulong)((iVar1 - (int)local_1a0) + 1) +
                 (ulong)(((local_1dc - (int)local_198) + 1) * (uint)local_1b0) +
                 CONCAT44(local_170._M_impl.super__Vector_impl_data._M_start._4_4_,
                          (int)local_170._M_impl.super__Vector_impl_data._M_start);
        pcVar18 = (char *)(lVar17 + local_190);
        if (*(char *)(local_190 + -1 + lVar17) == '\x03') {
          local_1e0 = iVar1 - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var7,&local_1e0);
          local_1e0 = local_1dc - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_1e0);
          pcVar18[-1] = '\x04';
        }
        if (*pcVar18 == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var7,
                     (value_type_conflict4 *)&local_138);
          local_1e0 = local_1dc - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_1e0);
          *pcVar18 = '\x04';
        }
        pcVar19 = pcVar18 + 1;
        if (pcVar18[1] == '\x03') {
          local_1e0 = (int)local_138._pointX.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var7,&local_1e0);
          local_1e0 = local_1dc - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_1e0);
          *pcVar19 = '\x04';
        }
        pcVar18 = pcVar19 + uVar13;
        if (pcVar19[uVar13] == '\x03') {
          local_1e0 = (int)local_138._pointX.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var7,&local_1e0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_1dc);
          *pcVar18 = '\x04';
        }
        pcVar19 = pcVar18 + 2;
        if (pcVar18[2] == '\x03') {
          local_1e0 = (int)local_138._pointX.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var7,&local_1e0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_1dc);
          *pcVar19 = '\x04';
        }
        if (pcVar19[uVar13] == '\x03') {
          local_1e0 = (int)local_138._pointX.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start - 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var7,&local_1e0);
          local_1e0 = local_1dc + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_1e0);
          pcVar19[uVar13] = '\x04';
        }
        if (pcVar18[uVar13 + 3] == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var7,
                     (value_type_conflict4 *)&local_138);
          local_1e0 = local_1dc + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_1e0);
          pcVar18[uVar13 + 3] = '\x04';
        }
        if (pcVar18[uVar13 + 4] == '\x03') {
          local_1e0 = (int)local_138._pointX.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)p_Var7,&local_1e0);
          local_1e0 = local_1dc + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,&local_1e0);
          pcVar18[uVar13 + 4] = '\x04';
        }
        lVar11 = lVar11 + 1;
        p_Var8 = local_178[4]._M_next;
      } while (lVar11 != (long)local_178[4]._M_prev - (long)p_Var8 >> 2);
    }
    puVar10 = local_1a8 + 1;
  } while( true );
}

Assistant:

const std::vector < BlobInfo > & BlobDetection::find( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width,
                                                          uint32_t height, BlobParameters parameter, uint8_t threshold )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );

        parameter._verify();

        _blob.clear();

        // we make the area by 2 pixels bigger in each direction so we don't need to check borders of map
        std::vector < uint8_t > imageMap( (width + 2) * (height + 2), EMPTY );

        uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        const uint32_t mapWidth = width + 2;

        std::vector < uint8_t >::iterator mapValueX = imageMap.begin() + mapWidth + 1;

        for( ; imageY != imageYEnd; imageY += rowSize, mapValueX += mapWidth ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            std::vector < uint8_t >::iterator mapValueY = mapValueX;

            for( ; imageX != imageXEnd; ++imageX, ++mapValueY ) {
                if( (*imageX) >= threshold )
                    *mapValueY = NOT_IN_USE;
            }
        }

        // find all blobs
        std::list < BlobInfo > foundBlob;

        mapValueX = imageMap.begin() + mapWidth;
        std::vector < uint8_t >::const_iterator endMap = imageMap.end() - mapWidth;

        for( ; mapValueX != endMap; ++mapValueX ) {
            if( *mapValueX == NOT_IN_USE ) { // blob found!
                foundBlob.push_back( BlobInfo() );

                BlobInfo & newBlob = foundBlob.back();

                uint32_t relativePosition = static_cast<uint32_t>(mapValueX - imageMap.begin());

                std::vector < uint32_t > & pointX = newBlob._pointX;
                std::vector < uint32_t > & pointY = newBlob._pointY;

                // we put extra shift [-1, -1] to point position because our map starts from [1, 1]
                // not from [0, 0]
                pointX.push_back( relativePosition % mapWidth + x - 1 );
                pointY.push_back( relativePosition / mapWidth + y - 1 );

                std::vector < uint32_t > & edgeX = newBlob._edgeX;
                std::vector < uint32_t > & edgeY = newBlob._edgeY;

                *mapValueX = FOUND;

                size_t pointId = 0;

                do {
                    uint32_t xMap = pointX[pointId];
                    uint32_t yMap = pointY[pointId++];

                    uint8_t neighbourCount = 0;

                    uint8_t * position = imageMap.data() + (yMap + 1 - y) * mapWidth + (xMap + 1 - x);

                    position = position - mapWidth - 1;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + 2;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    if( neighbourCount != 8 ) {
                        edgeX.push_back( xMap );
                        edgeY.push_back( yMap );
                        *(position - 1 - mapWidth) = EDGE;
                    }
                } while( pointId != pointX.size() );

                // Now we can extract outer edge points or so called contour points
                std::vector < uint32_t > & contourX = newBlob._contourX;
                std::vector < uint32_t > & contourY = newBlob._contourY;

                // we put extra shift [-1, -1] to point position because our map starts from [1, 1]
                // not from [0, 0]
                contourX.push_back( relativePosition % mapWidth + x - 1 );
                contourY.push_back( relativePosition / mapWidth + y - 1 );

                pointId = 0;

                *mapValueX = CONTOUR;

                do {
                    uint32_t xMap = contourX[pointId];
                    uint32_t yMap = contourY[pointId++];

                    uint8_t * position = imageMap.data() + (yMap + 1 - y) * mapWidth + (xMap + 1 - x);

                    position = position - mapWidth - 1;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap );
                        *(position) = CONTOUR;
                    }

                    position = position + 2;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap );
                        *(position) = CONTOUR;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }
                } while( pointId != contourX.size() );
            }
        }

        // All blobs found. Now we need to sort them
        if( parameter.circularity.checkMaximum || parameter.circularity.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getCircularity(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.circularity.checkMaximum && info.circularity() > parameter.circularity.maximum) ||
                       (parameter.circularity.checkMinimum && info.circularity() < parameter.circularity.minimum); } );
        }

        if( parameter.elongation.checkMaximum || parameter.elongation.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getElongation(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.elongation.checkMaximum && info.elongation() > parameter.elongation.maximum) ||
                       (parameter.elongation.checkMinimum && info.elongation() < parameter.elongation.minimum); } );
        }

        if( parameter.height.checkMaximum || parameter.height.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getHeight(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.height.checkMaximum && info.height() > parameter.height.maximum) ||
                       (parameter.height.checkMinimum && info.height() < parameter.height.minimum); } );
        }

        if( parameter.length.checkMaximum || parameter.length.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getLength(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.length.checkMaximum && info.length() > parameter.length.maximum) ||
                       (parameter.length.checkMinimum && info.length() < parameter.length.minimum); } );
        }

        if( parameter.size.checkMaximum || parameter.size.checkMinimum ) {
            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.size.checkMaximum && info.size() > parameter.size.maximum) ||
                       (parameter.size.checkMinimum && info.size() < parameter.size.minimum); } );
        }

        if( parameter.width.checkMaximum || parameter.width.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getWidth(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.width.checkMaximum && info.width() > parameter.width.maximum) ||
                       (parameter.width.checkMinimum && info.width() < parameter.width.minimum); } );
        }

        // prepare data for output
        std::vector <BlobInfo> blobTemp ( foundBlob.begin(), foundBlob.end() );
        std::swap( _blob, blobTemp );

        return get();
    }